

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O2

void __thiscall
QHttpNetworkConnectionPrivate::copyCredentials
          (QHttpNetworkConnectionPrivate *this,int fromChannel,QAuthenticator *auth,bool isProxy)

{
  int iVar1;
  QObject *this_00;
  ulong uVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((fromChannel < 0) || (auth->d == (QAuthenticatorPrivate *)0x0)) ||
     ((auth->d->method & ~Basic) != Negotiate)) {
    lVar3 = 0x68;
    for (uVar2 = 0; (long)uVar2 < (long)this->activeChannelCount; uVar2 = uVar2 + 1) {
      if ((uint)fromChannel != uVar2) {
        this_00 = &this->channels->super_QObject + lVar3;
        if (!isProxy) {
          this_00 = (QObject *)((long)this->channels + lVar3 + -8);
        }
        QAuthenticator::user((QString *)&local_50,(QAuthenticator *)this_00);
        QAuthenticator::user((QString *)&local_68,auth);
        iVar1 = QString::compare((QString *)&local_50,(CaseSensitivity)&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        if (iVar1 != 0) {
          QAuthenticator::user((QString *)&local_50,auth);
          QAuthenticator::setUser((QAuthenticator *)this_00,(QString *)&local_50);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        }
        QAuthenticator::password((QString *)&local_50,(QAuthenticator *)this_00);
        QAuthenticator::password((QString *)&local_68,auth);
        iVar1 = QString::compare((QString *)&local_50,(CaseSensitivity)&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        if (iVar1 != 0) {
          QAuthenticator::password((QString *)&local_50,auth);
          QAuthenticator::setPassword((QAuthenticator *)this_00,(QString *)&local_50);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        }
      }
      lVar3 = lVar3 + 0x108;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionPrivate::copyCredentials(int fromChannel, QAuthenticator *auth, bool isProxy)
{
    Q_ASSERT(auth);

    // NTLM and Negotiate do multi-phase authentication.
    // Copying credentialsbetween authenticators would mess things up.
    if (fromChannel >= 0) {
        QAuthenticatorPrivate *priv = QAuthenticatorPrivate::getPrivate(*auth);
        if (priv
            && (priv->method == QAuthenticatorPrivate::Ntlm
                || priv->method == QAuthenticatorPrivate::Negotiate)) {
            return;
        }
    }

    // select another channel
    QAuthenticator* otherAuth = nullptr;
    for (int i = 0; i < activeChannelCount; ++i) {
        if (i == fromChannel)
            continue;
        if (isProxy)
            otherAuth = &channels[i].proxyAuthenticator;
        else
            otherAuth = &channels[i].authenticator;
        // if the credentials are different, copy them
        if (otherAuth->user().compare(auth->user()))
            otherAuth->setUser(auth->user());
        if (otherAuth->password().compare(auth->password()))
            otherAuth->setPassword(auth->password());
    }
}